

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O3

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::NewCovergroupExpression>
          (SampledValueFuncVisitor *this,NewCovergroupExpression *expr)

{
  size_t sVar1;
  pointer ppEVar2;
  bool bVar3;
  KnownSystemName KVar4;
  Expression *pEVar5;
  Diagnostic *this_00;
  long lVar6;
  string_view arg;
  
  bVar3 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (bVar3) {
    KVar4 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
    sVar1 = expr[1].arguments._M_extent._M_extent_value;
    if (KVar4 == Past) {
      if (sVar1 != 4) goto LAB_00143fce;
      pEVar5 = expr[1].arguments._M_ptr[3];
    }
    else {
      if (sVar1 != 2) goto LAB_00143fce;
      pEVar5 = expr[1].arguments._M_ptr[1];
    }
    if (pEVar5->kind == EmptyArgument) {
LAB_00143fce:
      this_00 = AnalysisContext::addDiag
                          (this->context,this->parentSymbol,(DiagCode)0x8000e,
                           (expr->super_Expression).sourceRange);
      arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
      Diagnostic::operator<<(this_00,arg);
      return;
    }
  }
  else {
    sVar1 = (expr->arguments)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      ppEVar2 = (expr->arguments)._M_ptr;
      lVar6 = 0;
      do {
        pEVar5 = *(Expression **)((long)ppEVar2 + lVar6);
        ast::Expression::
        visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                  (pEVar5,pEVar5,this);
        lVar6 = lVar6 + 8;
      } while (sVar1 << 3 != lVar6);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }